

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::SeparationPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SeparationPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Separation Part:",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n Reason for Separation: ",0x19);
  ENUMS::GetEnumAsStringReasonForSeparation_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8Reason,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPre-Entity Indicator:  ",0x19);
  ENUMS::GetEnumAsStringPreEntityIndicator_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui8PreEntIndicator,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tParent Entity Id:      ",0x19);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_ParentEntId);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tStation Location:      ",0x19);
  NamedLocationIdentifier::GetAsString_abi_cxx11_(&local_220,&this->m_StationLoc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString SeparationPart::GetAsString() const
{
    KStringStream ss;

    ss << "Separation Part:"
       << "\n Reason for Separation: " << GetEnumAsStringReasonForSeparation(m_ui8Reason)
       << "\n\tPre-Entity Indicator:  " << GetEnumAsStringPreEntityIndicator( m_ui8PreEntIndicator )
       << "\n\tParent Entity Id:      " << m_ParentEntId.GetAsString()
       << "\n\tStation Location:      " << m_StationLoc.GetAsString();

    return ss.str();
}